

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O0

HTTPAPIEX_RESULT HTTPAPIEX_SetOption(HTTPAPIEX_HANDLE handle,char *optionName,void *value)

{
  HTTPAPI_RESULT HVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  HTTPAPI_RESULT HTTPAPI_result;
  LOGGER_LOG l_3;
  HTTPAPIEX_HANDLE_DATA *handleData;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  void *pvStack_40;
  HTTPAPI_RESULT saveOptionResult;
  void *savedOption;
  LOGGER_LOG l;
  void *pvStack_28;
  HTTPAPIEX_RESULT result;
  void *value_local;
  char *optionName_local;
  HTTPAPIEX_HANDLE handle_local;
  
  pvStack_28 = value;
  value_local = optionName;
  optionName_local = (char *)handle;
  if (((handle == (HTTPAPIEX_HANDLE)0x0) || (optionName == (char *)0x0)) || (value == (void *)0x0))
  {
    l._4_4_ = HTTPAPIEX_INVALID_ARG;
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      savedOption = p_Var3;
      pcVar4 = HTTPAPIEX_RESULTStrings(l._4_4_);
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiex.c"
                ,"HTTPAPIEX_SetOption",0x2a9,1,"error code = %s%s (%d)","",pcVar4,l._4_4_);
    }
  }
  else {
    HVar1 = HTTPAPI_CloneOption(optionName,value,&stack0xffffffffffffffc0);
    pcVar4 = optionName_local;
    if (HVar1 == HTTPAPI_INVALID_ARG) {
      l._4_4_ = HTTPAPIEX_INVALID_ARG;
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar4 = HTTPAPIEX_RESULTStrings(l._4_4_);
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiex.c"
                  ,"HTTPAPIEX_SetOption",0x2b7,1,"error code = %s%s (%d)","",pcVar4,l._4_4_);
      }
    }
    else if (HVar1 == HTTPAPI_OK) {
      iVar2 = createOrUpdateOption
                        ((HTTPAPIEX_HANDLE_DATA *)optionName_local,(char *)value_local,pvStack_40);
      if (iVar2 == 0) {
        if (*(long *)(pcVar4 + 0x10) == 0) {
          l._4_4_ = HTTPAPIEX_OK;
        }
        else {
          HVar1 = HTTPAPI_SetOption(*(HTTP_HANDLE *)(pcVar4 + 0x10),(char *)value_local,pvStack_28);
          if (HVar1 == HTTPAPI_OK) {
            l._4_4_ = HTTPAPIEX_OK;
          }
          else if (HVar1 == HTTPAPI_INVALID_ARG) {
            l._4_4_ = HTTPAPIEX_INVALID_ARG;
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              pcVar4 = HTTPAPIEX_RESULTStrings(l._4_4_);
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiex.c"
                        ,"HTTPAPIEX_SetOption",0x2d7,1,"error code = %s%s (%d)","",pcVar4,l._4_4_);
            }
          }
          else {
            l._4_4_ = HTTPAPIEX_ERROR;
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              pcVar4 = HTTPAPIEX_RESULTStrings(l._4_4_);
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiex.c"
                        ,"HTTPAPIEX_SetOption",0x2dc,1,"error code = %s%s (%d)","",pcVar4,l._4_4_);
            }
          }
        }
      }
      else {
        l._4_4_ = HTTPAPIEX_ERROR;
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar4 = HTTPAPIEX_RESULTStrings(l._4_4_);
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiex.c"
                    ,"HTTPAPIEX_SetOption",0x2c7,1,"error code = %s%s (%d)","",pcVar4,l._4_4_);
        }
      }
    }
    else {
      l._4_4_ = HTTPAPIEX_ERROR;
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar4 = HTTPAPIEX_RESULTStrings(l._4_4_);
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiex.c"
                  ,"HTTPAPIEX_SetOption",0x2bd,1,"error code = %s%s (%d)","",pcVar4,l._4_4_);
      }
    }
  }
  return l._4_4_;
}

Assistant:

HTTPAPIEX_RESULT HTTPAPIEX_SetOption(HTTPAPIEX_HANDLE handle, const char* optionName, const void* value)
{
    HTTPAPIEX_RESULT result;
    /*Codes_SRS_HTTPAPIEX_02_032: [If parameter handle is NULL then HTTPAPIEX_SetOption shall return HTTPAPIEX_INVALID_ARG.] */
    /*Codes_SRS_HTTPAPIEX_02_033: [If parameter optionName is NULL then HTTPAPIEX_SetOption shall return HTTPAPIEX_INVALID_ARG.] */
    /*Codes_SRS_HTTPAPIEX_02_034: [If parameter value is NULL then HTTPAPIEX_SetOption shall return HTTPAPIEX_INVALID_ARG.] */
    if (
        (handle == NULL) ||
        (optionName == NULL) ||
        (value == NULL)
        )
    {
        result = HTTPAPIEX_INVALID_ARG;
        LOG_HTTAPIEX_ERROR();
    }
    else
    {
        const void* savedOption;
        HTTPAPI_RESULT saveOptionResult;

        /*Codes_SRS_HTTPAPIEX_02_037: [HTTPAPIEX_SetOption shall attempt to save the value of the option by calling HTTPAPI_CloneOption passing optionName and value, irrespective of the existence of a HTTPAPI_HANDLE] */
        saveOptionResult = HTTPAPI_CloneOption(optionName, value, &savedOption);

        if(saveOptionResult == HTTPAPI_INVALID_ARG)
        {
            /*Codes_SRS_HTTPAPIEX_02_038: [If HTTPAPI_CloneOption returns HTTPAPI_INVALID_ARG then HTTPAPIEX shall return HTTPAPIEX_INVALID_ARG.] */
            result = HTTPAPIEX_INVALID_ARG;
            LOG_HTTAPIEX_ERROR();
        }
        else if (saveOptionResult != HTTPAPI_OK)
        {
            /*Codes_SRS_HTTPAPIEX_02_040: [For all other return values of HTTPAPI_SetOption, HTTPIAPIEX_SetOption shall return HTTPAPIEX_ERROR.] */
            result = HTTPAPIEX_ERROR;
            LOG_HTTAPIEX_ERROR();
        }
        else
        {
            HTTPAPIEX_HANDLE_DATA* handleData = (HTTPAPIEX_HANDLE_DATA*)handle;
            /*Codes_SRS_HTTPAPIEX_02_039: [If HTTPAPI_CloneOption returns HTTPAPI_OK then HTTPAPIEX_SetOption shall create or update the pair optionName/value.]*/
            if (createOrUpdateOption(handleData, optionName, savedOption) != 0)
            {
                /*Codes_SRS_HTTPAPIEX_02_041: [If creating or updating the pair optionName/value fails then shall return HTTPAPIEX_ERROR.] */
                result = HTTPAPIEX_ERROR;
                LOG_HTTAPIEX_ERROR();

            }
            else
            {
                /*Codes_SRS_HTTPAPIEX_02_031: [If HTTPAPI_HANDLE exists then HTTPAPIEX_SetOption shall call HTTPAPI_SetOption passing the same optionName and value and shall return a value conforming to the below table:] */
                if (handleData->httpHandle != NULL)
                {
                    HTTPAPI_RESULT HTTPAPI_result = HTTPAPI_SetOption(handleData->httpHandle, optionName, value);
                    if (HTTPAPI_result == HTTPAPI_OK)
                    {
                        result = HTTPAPIEX_OK;
                    }
                    else if (HTTPAPI_result == HTTPAPI_INVALID_ARG)
                    {
                        result = HTTPAPIEX_INVALID_ARG;
                        LOG_HTTAPIEX_ERROR();
                    }
                    else
                    {
                        result = HTTPAPIEX_ERROR;
                        LOG_HTTAPIEX_ERROR();
                    }
                }
                else
                {
                    result = HTTPAPIEX_OK;
                }
            }
        }
    }
    return result;
}